

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall
helics::ValueFederateManager::ValueFederateManager
          (ValueFederateManager *this,Core *coreOb,ValueFederate *vfed,LocalFederateId id,
          bool singleThreaded)

{
  _Rb_tree_header *p_Var1;
  bool enableLocking;
  
  this->useJsonSerialization = false;
  (this->fedID).fid = id.fid;
  enableLocking = !singleThreaded;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::shared_guarded_opt(&this->inputs,enableLocking);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::shared_guarded_opt(&this->publications,enableLocking);
  (this->CurrentTime).internalTimeCode = -1000000000;
  this->coreObject = coreOb;
  this->fed = vfed;
  *(undefined8 *)&(this->allCallback).m_obj.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->allCallback).m_obj.super__Function_base._M_functor + 8) = 0;
  (this->allCallback).m_obj.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->allCallback).m_obj._M_invoker = (_Invoker_type)0x0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->allCallback).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->allCallback).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
  ::shared_guarded_opt(&this->inputData,enableLocking);
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->targetIDs).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->targetIDs).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->targetIDs).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->targetIDs).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->targetIDs).enabled = enableLocking;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputTargets).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->inputTargets).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->inputTargets).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->inputTargets).enabled = enableLocking;
  return;
}

Assistant:

ValueFederateManager::ValueFederateManager(Core* coreOb,
                                           ValueFederate* vfed,
                                           LocalFederateId id,
                                           bool singleThreaded):
    fedID(id), inputs(!singleThreaded), publications(!singleThreaded), coreObject(coreOb),
    fed(vfed), inputData(!singleThreaded), targetIDs(!singleThreaded), inputTargets(!singleThreaded)
{
}